

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O0

void m256v_swap_rows(m256v *M,int r1,int r2)

{
  uint8_t uVar1;
  int in_EDX;
  int in_ESI;
  m256v *in_RDI;
  uint8_t sw;
  int i;
  size_t o2;
  size_t o1;
  int local_24;
  size_t local_20;
  size_t local_18;
  
  if (in_ESI != in_EDX) {
    local_18 = m256v_get_el_offs(in_RDI,in_ESI,0);
    local_20 = m256v_get_el_offs(in_RDI,in_EDX,0);
    for (local_24 = 0; local_24 < in_RDI->n_col; local_24 = local_24 + 1) {
      uVar1 = in_RDI->e[local_18];
      in_RDI->e[local_18] = in_RDI->e[local_20];
      in_RDI->e[local_20] = uVar1;
      local_18 = local_18 + 1;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void m256v_swap_rows(m256v* M, int r1, int r2)
{
	if (r1 == r2)
		return;

	size_t o1 = get_el_offs(M, r1, 0);
	size_t o2 = get_el_offs(M, r2, 0);
	for (int i = 0; i < M->n_col; ++i) {
		const uint8_t sw = M->e[o1];
		M->e[o1] = M->e[o2];
		M->e[o2] = sw;
		++o1;
		++o2;
	}
}